

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O3

type __thiscall
itlib::
flat_map<unsigned_long,Rml::FontFaceLayer*,itlib::fmimpl::less,std::vector<std::pair<unsigned_long,Rml::FontFaceLayer*>,std::allocator<std::pair<unsigned_long,Rml::FontFaceLayer*>>>>
::operator[]<unsigned_long&>
          (flat_map<unsigned_long,Rml::FontFaceLayer*,itlib::fmimpl::less,std::vector<std::pair<unsigned_long,Rml::FontFaceLayer*>,std::allocator<std::pair<unsigned_long,Rml::FontFaceLayer*>>>>
           *this,unsigned_long *k)

{
  iterator __position;
  FontFaceLayer *local_18;
  
  __position = flat_map<unsigned_long,_Rml::FontFaceLayer_*,_itlib::fmimpl::less,_std::vector<std::pair<unsigned_long,_Rml::FontFaceLayer_*>,_std::allocator<std::pair<unsigned_long,_Rml::FontFaceLayer_*>_>_>_>
               ::lower_bound<unsigned_long>
                         ((flat_map<unsigned_long,_Rml::FontFaceLayer_*,_itlib::fmimpl::less,_std::vector<std::pair<unsigned_long,_Rml::FontFaceLayer_*>,_std::allocator<std::pair<unsigned_long,_Rml::FontFaceLayer_*>_>_>_>
                           *)this,k);
  if ((__position._M_current == *(pair<unsigned_long,_Rml::FontFaceLayer_*> **)(this + 8)) ||
     (*k < (__position._M_current)->first)) {
    local_18 = (FontFaceLayer *)0x0;
    __position._M_current =
         (pair<unsigned_long,_Rml::FontFaceLayer_*> *)
         std::
         vector<std::pair<unsigned_long,Rml::FontFaceLayer*>,std::allocator<std::pair<unsigned_long,Rml::FontFaceLayer*>>>
         ::_M_emplace_aux<unsigned_long&,Rml::FontFaceLayer*>
                   ((vector<std::pair<unsigned_long,Rml::FontFaceLayer*>,std::allocator<std::pair<unsigned_long,Rml::FontFaceLayer*>>>
                     *)this,__position._M_current,k,&local_18);
  }
  return &(__position._M_current)->second;
}

Assistant:

typename std::enable_if<std::is_constructible<key_type, K>::value,
    mapped_type&>::type operator[](K&& k)
    {
        auto i = lower_bound(k);
        if (i != end() && !cmp()(k, *i))
        {
            return i->second;
        }

        i = m_container.emplace(i, std::forward<K>(k), mapped_type());
        return i->second;
    }